

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

string * __thiscall BayesianGameBase::SoftPrint_abi_cxx11_(BayesianGameBase *this)

{
  ostream *poVar1;
  long in_RSI;
  string *in_RDI;
  BayesianGameBase *in_stack_00000008;
  stringstream ss;
  string local_208 [32];
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [320];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  std::__cxx11::stringstream::stringstream(local_198);
  SoftPrintSummary_abi_cxx11_(in_stack_00000008);
  std::operator<<(local_188,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::operator<<(local_188,"joint type probs ");
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    PrintTools::SoftPrintVector<double>(in_stack_ffffffffffffffb8);
    std::operator<<(local_188,local_208);
    std::__cxx11::string::~string(local_208);
  }
  else {
    poVar1 = std::operator<<(local_188,"(sparse) ");
    PrintTools::SoftPrintVector<double>(in_stack_ffffffffffffffd8);
    std::operator<<(poVar1,local_1e8);
    std::__cxx11::string::~string(local_1e8);
  }
  std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BayesianGameBase::SoftPrint() const
{
    stringstream ss;
    ss << this->SoftPrintSummary();
/*  
    ss << "Bayesian game with "<<_m_nrAgents<<" agents"<<endl;
    ss << "Number of actions ";
    ss << SoftPrintVector(_m_nrActions);
    ss << " ("<< _m_nrJA <<" joint actions)";
    ss << "\nNumber of types ";
    ss << SoftPrintVector(_m_nrTypes);
    ss << " ("<< _m_nrJTypes <<" joint types)"<<endl;
*/    
    ss << "joint type probs ";
    if(_m_useSparse)
        ss << "(sparse) " << SoftPrintVector(_m_jTypeProbsSparse);
    else
        ss << SoftPrintVector(_m_jTypeProbs);
    ss << endl;
    return(ss.str());
}